

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixture.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
celero::TestFixture::getUserDefinedMeasurementNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TestFixture *this)

{
  pointer psVar1;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  udms;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_TestFixture[9])(&local_60);
  if (local_60.
      super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = local_60.
             super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      (**(code **)(*(long *)(psVar1->
                            super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + 0x18))(&local_48);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      psVar1 = psVar1 + 1;
    } while (psVar1 != local_60.
                       super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> TestFixture::getUserDefinedMeasurementNames() const
{
	std::vector<std::string> names;
	const auto udms = this->getUserDefinedMeasurements();

	if(udms.empty() == false)
	{
		for(const auto& udm : udms)
		{
			names.emplace_back(udm->getName());
		}
	}

	return names;
}